

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void __thiscall acto::core::runtime_t::runtime_t(runtime_t *this)

{
  uint uVar1;
  runtime_t *local_38;
  code *local_30;
  undefined8 local_28;
  runtime_t *local_10;
  runtime_t *this_local;
  
  local_10 = this;
  worker_t::callbacks::callbacks(&this->super_callbacks);
  (this->super_callbacks)._vptr_callbacks = (_func_int **)&PTR__runtime_t_0027fbe0;
  uVar1 = std::thread::hardware_concurrency();
  this->m_processors = (ulong)uVar1;
  std::mutex::mutex(&this->mutex_);
  event::event(&this->no_actors_event_,false);
  event::event(&this->queue_event_,true);
  event::event(&this->idle_workers_event_,true);
  event::event(&this->no_workers_event_,false);
  std::
  unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
  ::unordered_set(&this->actors_);
  intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::queue(&this->queue_);
  workers_t::workers_t(&this->workers_);
  std::atomic<bool>::atomic(&this->active_,true);
  std::atomic<bool>::atomic(&this->terminating_,false);
  local_30 = execute;
  local_28 = 0;
  local_38 = this;
  std::thread::thread<void(acto::core::runtime_t::*)(),acto::core::runtime_t*,void>
            (&this->m_scheduler,(type *)&local_30,&local_38);
  event::signaled(&this->no_actors_event_);
  event::signaled(&this->no_workers_event_);
  return;
}

Assistant:

runtime_t::runtime_t()
  : m_scheduler(&runtime_t::execute, this) {
  no_actors_event_.signaled();
  no_workers_event_.signaled();
}